

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::PrintTestPartResultToString_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TestPartResult *test_part_result)

{
  Message *pMVar1;
  int in_ECX;
  internal *this_00;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  char *local_40;
  char *local_38;
  string local_30;
  
  Message::Message((Message *)&local_48);
  this_00 = *(internal **)(this + 0x10);
  if (this_00 != (internal *)0x0) {
    this_00 = *(internal **)(this + 8);
  }
  FormatFileLocation_abi_cxx11_(&local_30,this_00,(char *)(ulong)*(uint *)(this + 0x28),in_ECX);
  std::operator<<((ostream *)(local_48.ptr_ + 0x10),(string *)&local_30);
  std::operator<<((ostream *)(local_48.ptr_ + 0x10)," ");
  if ((ulong)*(uint *)this < 3) {
    local_38 = &DAT_001465a0 + *(int *)(&DAT_001465a0 + (ulong)*(uint *)this * 4);
  }
  else {
    local_38 = "Unknown result type";
  }
  pMVar1 = Message::operator<<((Message *)&local_48,&local_38);
  local_40 = *(char **)(this + 0x50);
  pMVar1 = Message::operator<<(pMVar1,&local_40);
  Message::GetString_abi_cxx11_(__return_storage_ptr__,pMVar1);
  std::__cxx11::string::~string((string *)&local_30);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_48);
  return __return_storage_ptr__;
}

Assistant:

static std::string PrintTestPartResultToString(
    const TestPartResult& test_part_result) {
  return (Message()
          << internal::FormatFileLocation(test_part_result.file_name(),
                                          test_part_result.line_number())
          << " " << TestPartResultTypeToString(test_part_result.type())
          << test_part_result.message()).GetString();
}